

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_gc(lua_State *L,int what,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  int stepsize;
  int stepmul;
  int pause;
  int majormul;
  int minormul;
  int data_2;
  int data_1;
  lu_byte oldstp;
  l_mem debt;
  global_State *pgStack_48;
  int data;
  global_State *g;
  undefined4 local_38;
  int res;
  va_list argp;
  int what_local;
  lua_State *L_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  g._4_4_ = 0;
  pgStack_48 = L->l_G;
  if ((pgStack_48->gcstp & 2) == 0) {
    iVar1 = **(int **)&L[-1].hookmask;
    **(int **)&L[-1].hookmask = iVar1 + 1;
    local_118 = in_RDX;
    local_110 = in_RCX;
    local_108 = in_R8;
    local_100 = in_R9;
    argp[0].reg_save_area._4_4_ = what;
    if (iVar1 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x56e,"int lua_gc(lua_State *, int, ...)");
    }
    argp[0].overflow_arg_area = local_128;
    argp[0]._0_8_ = &stack0x00000008;
    res = 0x30;
    local_38 = 0x10;
    switch(what) {
    case 0:
      pgStack_48->gcstp = '\x01';
      break;
    case 1:
      luaE_setdebt(pgStack_48,0);
      pgStack_48->gcstp = '\0';
      break;
    case 2:
      luaC_fullgc(L,0);
      break;
    case 3:
      g._4_4_ = (uint)((ulong)(pgStack_48->totalbytes + pgStack_48->GCdebt) >> 10);
      break;
    case 4:
      g._4_4_ = (int)pgStack_48->totalbytes + (int)pgStack_48->GCdebt & 0x3ff;
      break;
    case 5:
      res = 0x30;
      local_38 = 0x18;
      g._4_4_ = 0;
      _data_1 = 1;
      data_2._3_1_ = pgStack_48->gcstp;
      pgStack_48->gcstp = '\0';
      if ((int)local_118 == 0) {
        luaE_setdebt(pgStack_48,0);
        luaC_step(L);
      }
      else {
        _data_1 = (long)(int)local_118 * 0x400 + pgStack_48->GCdebt;
        luaE_setdebt(pgStack_48,_data_1);
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
      }
      pgStack_48->gcstp = data_2._3_1_;
      if ((0 < _data_1) && (pgStack_48->gcstate == '\b')) {
        g._4_4_ = 1;
      }
      break;
    case 6:
      res = 0x30;
      local_38 = 0x18;
      g._4_4_ = (uint)pgStack_48->gcpause << 2;
      pgStack_48->gcpause = (lu_byte)((long)(int)local_118 / 4);
      break;
    case 7:
      res = 0x30;
      local_38 = 0x18;
      g._4_4_ = (uint)pgStack_48->gcstepmul << 2;
      pgStack_48->gcstepmul = (lu_byte)((long)(int)local_118 / 4);
      break;
    default:
      g._4_4_ = 0xffffffff;
      break;
    case 9:
      g._4_4_ = (uint)(pgStack_48->gcstp == '\0');
      break;
    case 10:
      res = 0x30;
      local_38 = 0x20;
      bVar2 = true;
      if (pgStack_48->gckind != '\x01') {
        bVar2 = pgStack_48->lastatomic != 0;
      }
      g._4_4_ = 0xb;
      if (bVar2) {
        g._4_4_ = 10;
      }
      if ((int)local_118 != 0) {
        pgStack_48->genminormul = (lu_byte)(int)local_118;
      }
      if ((int)local_110 != 0) {
        pgStack_48->genmajormul = (lu_byte)((long)(int)local_110 / 4);
      }
      luaC_changemode(L,1);
      break;
    case 0xb:
      res = 0x30;
      local_38 = 0x28;
      bVar2 = true;
      if (pgStack_48->gckind != '\x01') {
        bVar2 = pgStack_48->lastatomic != 0;
      }
      g._4_4_ = 0xb;
      if (bVar2) {
        g._4_4_ = 10;
      }
      if ((int)local_118 != 0) {
        pgStack_48->gcpause = (lu_byte)((long)(int)local_118 / 4);
      }
      if ((int)local_110 != 0) {
        pgStack_48->gcstepmul = (lu_byte)((long)(int)local_110 / 4);
      }
      if ((int)local_108 != 0) {
        pgStack_48->gcstepsize = (lu_byte)(int)local_108;
      }
      luaC_changemode(L,0);
    }
    iVar1 = **(int **)&L[-1].hookmask + -1;
    **(int **)&L[-1].hookmask = iVar1;
    if (iVar1 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5c6,"int lua_gc(lua_State *, int, ...)");
    }
    L_local._4_4_ = g._4_4_;
  }
  else {
    L_local._4_4_ = 0xffffffff;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_gc (lua_State *L, int what, ...) {
  va_list argp;
  int res = 0;
  global_State *g = G(L);
  if (g->gcstp & GCSTPGC)  /* internal stop? */
    return -1;  /* all options are invalid when stopped */
  lua_lock(L);
  va_start(argp, what);
  switch (what) {
    case LUA_GCSTOP: {
      g->gcstp = GCSTPUSR;  /* stopped by the user */
      break;
    }
    case LUA_GCRESTART: {
      luaE_setdebt(g, 0);
      g->gcstp = 0;  /* (GCSTPGC must be already zero here) */
      break;
    }
    case LUA_GCCOLLECT: {
      luaC_fullgc(L, 0);
      break;
    }
    case LUA_GCCOUNT: {
      /* GC values are expressed in Kbytes: #bytes/2^10 */
      res = cast_int(gettotalbytes(g) >> 10);
      break;
    }
    case LUA_GCCOUNTB: {
      res = cast_int(gettotalbytes(g) & 0x3ff);
      break;
    }
    case LUA_GCSTEP: {
      int data = va_arg(argp, int);
      l_mem debt = 1;  /* =1 to signal that it did an actual step */
      lu_byte oldstp = g->gcstp;
      g->gcstp = 0;  /* allow GC to run (GCSTPGC must be zero here) */
      if (data == 0) {
        luaE_setdebt(g, 0);  /* do a basic step */
        luaC_step(L);
      }
      else {  /* add 'data' to total debt */
        debt = cast(l_mem, data) * 1024 + g->GCdebt;
        luaE_setdebt(g, debt);
        luaC_checkGC(L);
      }
      g->gcstp = oldstp;  /* restore previous state */
      if (debt > 0 && g->gcstate == GCSpause)  /* end of cycle? */
        res = 1;  /* signal it */
      break;
    }
    case LUA_GCSETPAUSE: {
      int data = va_arg(argp, int);
      res = getgcparam(g->gcpause);
      setgcparam(g->gcpause, data);
      break;
    }
    case LUA_GCSETSTEPMUL: {
      int data = va_arg(argp, int);
      res = getgcparam(g->gcstepmul);
      setgcparam(g->gcstepmul, data);
      break;
    }
    case LUA_GCISRUNNING: {
      res = gcrunning(g);
      break;
    }
    case LUA_GCGEN: {
      int minormul = va_arg(argp, int);
      int majormul = va_arg(argp, int);
      res = isdecGCmodegen(g) ? LUA_GCGEN : LUA_GCINC;
      if (minormul != 0)
        g->genminormul = minormul;
      if (majormul != 0)
        setgcparam(g->genmajormul, majormul);
      luaC_changemode(L, KGC_GEN);
      break;
    }
    case LUA_GCINC: {
      int pause = va_arg(argp, int);
      int stepmul = va_arg(argp, int);
      int stepsize = va_arg(argp, int);
      res = isdecGCmodegen(g) ? LUA_GCGEN : LUA_GCINC;
      if (pause != 0)
        setgcparam(g->gcpause, pause);
      if (stepmul != 0)
        setgcparam(g->gcstepmul, stepmul);
      if (stepsize != 0)
        g->gcstepsize = stepsize;
      luaC_changemode(L, KGC_INC);
      break;
    }
    default: res = -1;  /* invalid option */
  }
  va_end(argp);
  lua_unlock(L);
  return res;
}